

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void * TempChangeHandler(void *service)

{
  int iVar1;
  uint uVar2;
  allocator<char> *unaff_retaddr;
  char *in_stack_00000008;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000010;
  uint32_t in_stack_000003f4;
  char *in_stack_000003f8;
  fnode_service_t *in_stack_00000400;
  allocator<char> local_9 [9];
  
  if ((TempChangeHandler(void*)::msg_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&TempChangeHandler(void*)::msg_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr);
    std::allocator<char>::~allocator(local_9);
    __cxa_atexit(std::__cxx11::string::~string,&TempChangeHandler(void*)::msg_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&TempChangeHandler(void*)::msg_abi_cxx11_);
  }
  do {
    uVar2 = getCoreTemp();
    sprintf(TempChangeHandler::temp_str,"%d",(ulong)uVar2);
    std::__cxx11::string::clear();
    std::__cxx11::string::append((char *)&TempChangeHandler(void*)::msg_abi_cxx11_);
    std::__cxx11::string::append((char *)&TempChangeHandler(void*)::msg_abi_cxx11_);
    std::__cxx11::string::c_str();
    std::__cxx11::string::length();
    fnode_service_notify_state(in_stack_00000400,in_stack_000003f8,in_stack_000003f4);
    usleep(1000000);
  } while( true );
}

Assistant:

void* TempChangeHandler(void* service)
{
	static string msg="";
	static char temp_str[32];
	for(;;)
	{		
		sprintf(temp_str, "%d", getCoreTemp());
		msg.clear();
		msg.append("0");
		msg.append(temp_str);
		//cout << msg << endl;
		fnode_service_notify_state((fnode_service_t *)service, msg.c_str(), msg.length());
		usleep(1000000L);				
	}    
}